

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaveLoader.h
# Opt level: O2

void __thiscall
frontend::loaders::SaveLoader<fp_remover::classes::Wrestler>::~SaveLoader
          (SaveLoader<fp_remover::classes::Wrestler> *this)

{
  char cVar1;
  
  this->_vptr_SaveLoader = (_func_int **)&PTR___cxa_pure_virtual_00108d98;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::fstream::close();
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::clear
            (&this->contents);
  if (this->f != (fstream *)0x0) {
    (**(code **)(*(long *)this->f + 8))();
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  ~vector(&this->contents);
  std::__cxx11::string::~string((string *)&this->filename);
  return;
}

Assistant:

~SaveLoader()
	{
		if(f->is_open()) f->close();
		contents.clear();
		delete f;
	}